

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::LatchVisitor::visit(LatchVisitor *this,Generator *generator)

{
  StatementType SVar1;
  StatementBlockType SVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *this_00;
  element_type *peVar4;
  element_type *stmt_00;
  element_type *stmt_01;
  undefined1 local_78 [8];
  shared_ptr<kratos::SequentialStmtBlock> stmt__1;
  shared_ptr<kratos::CombinationalStmtBlock> stmt_;
  undefined1 local_48 [8];
  shared_ptr<kratos::StmtBlock> blk;
  shared_ptr<kratos::Stmt> stmt;
  uint64_t i;
  uint64_t stmt_count;
  Generator *generator_local;
  LatchVisitor *this_local;
  
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Generator::stmts_count(generator);
  for (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < p_Var3;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    Generator::get_stmt((Generator *)
                        &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(uint32_t)generator);
    this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    SVar1 = Stmt::type(this_00);
    if (SVar1 == Block) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      Stmt::as<kratos::StmtBlock>((Stmt *)local_48);
      peVar4 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      SVar2 = StmtBlock::block_type(peVar4);
      if (SVar2 == Combinational) {
        std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_48);
        Stmt::as<kratos::CombinationalStmtBlock>
                  ((Stmt *)&stmt__1.
                            super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        stmt_00 = std::__shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              *)&stmt__1.
                                 super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
        check_combinational(stmt_00);
        std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
                  ((shared_ptr<kratos::CombinationalStmtBlock> *)
                   &stmt__1.
                    super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        SVar2 = StmtBlock::block_type(peVar4);
        if (SVar2 == Sequential) {
          std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_48);
          Stmt::as<kratos::SequentialStmtBlock>((Stmt *)local_78);
          stmt_01 = std::__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                *)local_78);
          check_sequential(stmt_01);
          std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
                    ((shared_ptr<kratos::SequentialStmtBlock> *)local_78);
        }
      }
      std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_48);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr
              ((shared_ptr<kratos::Stmt> *)
               &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto blk = stmt->as<StmtBlock>();
                if (blk->block_type() == StatementBlockType::Combinational) {
                    // multiple passes to extract assigned variables
                    auto stmt_ = blk->as<CombinationalStmtBlock>();
                    check_combinational(stmt_.get());
                } else if (blk->block_type() == StatementBlockType::Sequential) {
                    // multiple passes to extract assigned variables
                    auto stmt_ = blk->as<SequentialStmtBlock>();
                    check_sequential(stmt_.get());
                }
            }
        }
    }